

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool __thiscall Catch::TestCase::operator==(TestCase *this,TestCase *other)

{
  size_t sVar1;
  int iVar2;
  
  if ((this->test).m_p != (other->test).m_p) {
    return false;
  }
  sVar1 = (this->super_TestCaseInfo).name._M_string_length;
  if ((sVar1 == (other->super_TestCaseInfo).name._M_string_length) &&
     (((sVar1 == 0 ||
       (iVar2 = bcmp((this->super_TestCaseInfo).name._M_dataplus._M_p,
                     (other->super_TestCaseInfo).name._M_dataplus._M_p,sVar1), iVar2 == 0)) &&
      (sVar1 = (this->super_TestCaseInfo).className._M_string_length,
      sVar1 == (other->super_TestCaseInfo).className._M_string_length)))) {
    if (sVar1 != 0) {
      iVar2 = bcmp((this->super_TestCaseInfo).className._M_dataplus._M_p,
                   (other->super_TestCaseInfo).className._M_dataplus._M_p,sVar1);
      return iVar2 == 0;
    }
    return true;
  }
  return false;
}

Assistant:

T* get() const { return m_p; }